

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_cmdline_callback_(int id,char *arg)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *in_RSI;
  int in_EDI;
  char *in_stack_ffffffffffffffd8;
  FILE *__stream;
  int local_18;
  
  if (in_EDI == -0x7fffffff) {
    fprintf(_stderr,"Unrecognized command line option \'%s\'.\n",in_RSI);
    fprintf(_stderr,"Try \'%s --help\' for more information.\n",acutest_argv0_);
    acutest_exit_(0);
  }
  if (in_EDI == -0x7ffffffe) {
    fprintf(_stderr,"The command line option \'%s\' requires an argument.\n",in_RSI);
    fprintf(_stderr,"Try \'%s --help\' for more information.\n",acutest_argv0_);
    acutest_exit_(0);
  }
  if (in_EDI == -0x7ffffffd) {
    fprintf(_stderr,"The command line option \'%s\' does not expect an argument.\n",in_RSI);
    fprintf(_stderr,"Try \'%s --help\' for more information.\n",acutest_argv0_);
    acutest_exit_(0);
  }
  if (in_EDI == 0) {
    iVar1 = acutest_select_(in_stack_ffffffffffffffd8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s: Unrecognized unit test \'%s\'\n",acutest_argv0_,in_RSI);
      fprintf(_stderr,"Try \'%s --list\' for list of unit tests.\n",acutest_argv0_);
      acutest_exit_(0);
    }
  }
  else if (in_EDI == 0x43) {
    acutest_colorize_ = 0;
  }
  else if (in_EDI == 0x45) {
    acutest_no_exec_ = 1;
  }
  else if (in_EDI == 0x53) {
    acutest_no_summary_ = 1;
  }
  else if (in_EDI == 0x54) {
    acutest_tap_ = 1;
  }
  else if (in_EDI == 0x58) {
    acutest_exclude_mode_ = 1;
  }
  else if (in_EDI == 99) {
    if ((in_RSI == (char *)0x0) || (iVar1 = strcmp(in_RSI,"always"), iVar1 == 0)) {
      acutest_colorize_ = 1;
    }
    else {
      iVar1 = strcmp(in_RSI,"never");
      if (iVar1 == 0) {
        acutest_colorize_ = 0;
      }
      else {
        iVar1 = strcmp(in_RSI,"auto");
        if (iVar1 != 0) {
          fprintf(_stderr,"%s: Unrecognized argument \'%s\' for option --color.\n",acutest_argv0_,
                  in_RSI);
          fprintf(_stderr,"Try \'%s --help\' for more information.\n",acutest_argv0_);
          acutest_exit_(0);
        }
      }
    }
  }
  else if (in_EDI == 0x65) {
    if ((in_RSI == (char *)0x0) || (iVar1 = strcmp(in_RSI,"always"), iVar1 == 0)) {
      acutest_no_exec_ = 0;
    }
    else {
      iVar1 = strcmp(in_RSI,"never");
      if (iVar1 == 0) {
        acutest_no_exec_ = 1;
      }
      else {
        iVar1 = strcmp(in_RSI,"auto");
        if (iVar1 != 0) {
          fprintf(_stderr,"%s: Unrecognized argument \'%s\' for option --exec.\n",acutest_argv0_,
                  in_RSI);
          fprintf(_stderr,"Try \'%s --help\' for more information.\n",acutest_argv0_);
          acutest_exit_(0);
        }
      }
    }
  }
  else {
    if (in_EDI == 0x68) {
      acutest_help_();
      acutest_exit_(0);
    }
    if (in_EDI == 0x6c) {
      acutest_list_names_();
      acutest_exit_(0);
    }
    if (in_EDI == 0x71) {
      acutest_verbose_level_ = 0;
    }
    else if (in_EDI != 0x74) {
      if (in_EDI == 0x76) {
        if (in_RSI == (char *)0x0) {
          local_18 = acutest_verbose_level_ + 1;
        }
        else {
          local_18 = atoi(in_RSI);
        }
        acutest_verbose_level_ = local_18;
      }
      else if (in_EDI == 0x77) {
        acutest_worker_ = 1;
        acutest_worker_index_ = atoi(in_RSI);
      }
      else if ((in_EDI == 0x78) &&
              (acutest_xml_output_ = (FILE *)fopen(in_RSI,"w"),
              (FILE *)acutest_xml_output_ == (FILE *)0x0)) {
        __stream = _stderr;
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        fprintf(__stream,"Unable to open \'%s\': %s\n",in_RSI,pcVar3);
        acutest_exit_(0);
      }
    }
  }
  return 0;
}

Assistant:

static int
acutest_cmdline_callback_(int id, const char* arg)
{
    switch(id) {
        case 'X':
            acutest_exclude_mode_ = 1;
            break;

        case 'e':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                acutest_no_exec_ = 0;
            } else if(strcmp(arg, "never") == 0) {
                acutest_no_exec_ = 1;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --exec.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case 'E':
            acutest_no_exec_ = 1;
            break;

        case 't':
#if defined ACUTEST_WIN_  ||  defined ACUTEST_HAS_POSIX_TIMER_
            if(arg == NULL || strcmp(arg, "real") == 0) {
                acutest_timer_ = 1;
    #ifndef ACUTEST_WIN_
            } else if(strcmp(arg, "cpu") == 0) {
                acutest_timer_ = 2;
    #endif
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --time.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
#endif
            break;

        case 'S':
            acutest_no_summary_ = 1;
            break;

        case 'T':
            acutest_tap_ = 1;
            break;

        case 'l':
            acutest_list_names_();
            acutest_exit_(0);
            break;

        case 'v':
            acutest_verbose_level_ = (arg != NULL ? atoi(arg) : acutest_verbose_level_+1);
            break;

        case 'q':
            acutest_verbose_level_ = 0;
            break;

        case 'c':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                acutest_colorize_ = 1;
            } else if(strcmp(arg, "never") == 0) {
                acutest_colorize_ = 0;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --color.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case 'C':
            acutest_colorize_ = 0;
            break;

        case 'h':
            acutest_help_();
            acutest_exit_(0);
            break;

        case 'w':
            acutest_worker_ = 1;
            acutest_worker_index_ = atoi(arg);
            break;
        case 'x':
            acutest_xml_output_ = fopen(arg, "w");
            if (!acutest_xml_output_) {
                fprintf(stderr, "Unable to open '%s': %s\n", arg, strerror(errno));
                acutest_exit_(2);
            }
            break;

        case 0:
            if(acutest_select_(arg) == 0) {
                fprintf(stderr, "%s: Unrecognized unit test '%s'\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --list' for list of unit tests.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case ACUTEST_CMDLINE_OPTID_UNKNOWN_:
            fprintf(stderr, "Unrecognized command line option '%s'.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;

        case ACUTEST_CMDLINE_OPTID_MISSINGARG_:
            fprintf(stderr, "The command line option '%s' requires an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;

        case ACUTEST_CMDLINE_OPTID_BOGUSARG_:
            fprintf(stderr, "The command line option '%s' does not expect an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;
    }

    return 0;
}